

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_flow.h
# Opt level: O3

void __thiscall max_flow_algo::gap_heuristic(max_flow_algo *this,NodeID level)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar4;
  pointer pvVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  this->m_gaps = this->m_gaps + 1;
  pvVar4 = this->adj;
  pvVar5 = (pvVar4->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar4->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
    uVar8 = 0;
    do {
      if ((this->active->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar8] < 0) {
        piVar2 = (this->m_distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (level <= piVar2[uVar8]) {
          piVar3 = (this->m_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar1 = piVar3 + piVar2[uVar8];
          *piVar1 = *piVar1 + -1;
          iVar7 = this->rn;
          if (this->rn < piVar2[uVar8]) {
            iVar7 = piVar2[uVar8];
          }
          piVar2[uVar8] = iVar7;
          piVar1 = piVar3 + iVar7;
          *piVar1 = *piVar1 + 1;
          enqueue(this,(NodeID)uVar8);
          pvVar4 = this->adj;
          pvVar5 = (pvVar4->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
      }
      uVar8 = uVar8 + 1;
      uVar6 = ((long)(pvVar4->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
              -0x5555555555555555;
    } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
  }
  return;
}

Assistant:

void gap_heuristic(NodeID level)
    {
        m_gaps++;
        for (NodeID node = 0; node < adj.size(); node++)
        {
            if (isActive(node))
            {
                if (m_distance[node] < level)
                    continue;
                m_count[m_distance[node]]--;
                m_distance[node] = std::max(m_distance[node], rn);
                m_count[m_distance[node]]++;
                enqueue(node);
            }
        }
    }